

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

int kvtree_file_unlock(char *file,int fd)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  int fd_local;
  char *file_local;
  
  iVar2 = flock(fd,8);
  if (iVar2 != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",file,
               (ulong)(uint)fd,8,(ulong)uVar1,pcVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0xb9);
  }
  file_local._4_4_ = (uint)(iVar2 != 0);
  return file_local._4_4_;
}

Assistant:

int kvtree_file_unlock(const char* file, int fd)
{
  #ifdef KVTREE_FILE_LOCK_USE_FLOCK
    if (flock(fd, LOCK_UN) != 0) {
      kvtree_err("Failed to acquire file lock on %s: flock(%d, %d) errno=%d %s @ %s:%d",
        file, fd, LOCK_UN, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  #ifdef KVTREE_FILE_LOCK_USE_FCNTL
    struct flock lck;
    lck.l_type = F_UNLCK;
    lck.l_whence = 0;
    lck.l_start = 0L;
    lck.l_len = 0L; //locking the entire file

    if(fcntl(fd, F_SETLK, &lck) < 0) {
      kvtree_err("Failed to acquire file read lock on %s: fnctl(%d, %d) errno=%d %s @ %s:%d",
        file, fd, F_UNLCK, errno, strerror(errno), __FILE__, __LINE__
      );
      return KVTREE_FAILURE;
    }
  #endif

  return KVTREE_SUCCESS;
}